

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

Vector<int,_3> __thiscall tcu::computeScaledSize<3>(tcu *this,Vector<int,_3> *imageSize,int maxSize)

{
  bool bVar1;
  bool bVar2;
  deInt32 y;
  int iVar3;
  int *piVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  Vector<int,_3> VVar5;
  undefined4 local_30;
  undefined4 local_2c;
  int i_2;
  int i_1;
  float d;
  int i;
  bool allInRange;
  int maxSize_local;
  Vector<int,_3> *imageSize_local;
  Vector<int,_3> *res;
  
  bVar1 = true;
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    bVar2 = false;
    if (bVar1) {
      piVar4 = Vector<int,_3>::operator[](imageSize,i_1);
      bVar2 = *piVar4 <= maxSize;
    }
    bVar1 = bVar2;
  }
  if (bVar1) {
    Vector<int,_3>::Vector((Vector<int,_3> *)this,imageSize);
    iVar3 = extraout_EDX;
  }
  else {
    i_2 = 0x3f800000;
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      piVar4 = Vector<int,_3>::operator[](imageSize,local_2c);
      i_2 = (int)de::max<float>((float)i_2,(float)*piVar4 / (float)maxSize);
    }
    Vector<int,_3>::Vector((Vector<int,_3> *)this);
    iVar3 = extraout_EDX_00;
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      piVar4 = Vector<int,_3>::operator[](imageSize,local_30);
      y = deRoundFloatToInt32((float)*piVar4 / (float)i_2);
      iVar3 = de::max<int>(1,y);
      piVar4 = Vector<int,_3>::operator[]((Vector<int,_3> *)this,local_30);
      *piVar4 = iVar3;
      iVar3 = extraout_EDX_01;
    }
  }
  VVar5.m_data[2] = iVar3;
  VVar5.m_data._0_8_ = this;
  return (Vector<int,_3>)VVar5.m_data;
}

Assistant:

static Vector<int, Size> computeScaledSize (const Vector<int, Size>& imageSize, int maxSize)
{
	bool allInRange = true;
	for (int i = 0; i < Size; i++)
		allInRange = allInRange && (imageSize[i] <= maxSize);

	if (allInRange)
		return imageSize;
	else
	{
		float d = 1.0f;
		for (int i = 0; i < Size; i++)
			d = de::max(d, (float)imageSize[i] / (float)maxSize);

		Vector<int, Size> res;
		for (int i = 0; i < Size; i++)
			res[i] = de::max(1, deRoundFloatToInt32((float)imageSize[i] / d));

		return res;
	}
}